

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O0

base_learner * binary_setup(options_i *options,vw *all)

{
  learner<char,_example> *base;
  undefined8 *in_RDI;
  learner<char,_example> *ret;
  option_group_definition new_options;
  bool binary;
  typed_option<bool> *in_stack_fffffffffffffd88;
  vw *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  typed_option<bool> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  typed_option<bool> local_1d0;
  learner<char,_char> *in_stack_ffffffffffffff50;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  undefined8 *local_10;
  vw *local_8;
  
  local_19 = 0;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Binary loss",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd90,
             (string *)in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"binary",&local_1f1);
  VW::config::make_option<bool>(in_stack_fffffffffffffd98,(bool *)in_stack_fffffffffffffd90);
  VW::config::typed_option<bool>::keep(&local_1d0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_218,"report loss as binary classification on -1,1",
             (allocator *)&stack0xfffffffffffffde7);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_10)(local_10,local_58);
  if ((local_19 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else {
    setup_base((options_i *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    LEARNER::as_singleline<char,char>(in_stack_ffffffffffffff50);
    base = LEARNER::init_learner<char,example,LEARNER::learner<char,example>>
                     ((learner<char,_example> *)in_stack_fffffffffffffd90,
                      (_func_void_char_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffd88,
                      (_func_void_char_ptr_learner<char,_example>_ptr_example_ptr *)0x3a820f);
    in_stack_fffffffffffffd90 = (vw *)LEARNER::make_base<char,example>(base);
    local_8 = in_stack_fffffffffffffd90;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd90);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* binary_setup(options_i& options, vw& all)
{
  bool binary = false;
  option_group_definition new_options("Binary loss");
  new_options.add(make_option("binary", binary).keep().help("report loss as binary classification on -1,1"));
  options.add_and_parse(new_options);

  if (!binary)
    return nullptr;

  LEARNER::learner<char, example>& ret =
      LEARNER::init_learner(as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  return make_base(ret);
}